

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O2

SXML_CHAR * XMLSearch_get_XPath_string(XMLSearch *search,SXML_CHAR **xpath,SXML_CHAR quote)

{
  int iVar1;
  bool bVar2;
  SXML_CHAR *pSVar3;
  char *src2;
  long lVar4;
  char *pcVar5;
  long lVar6;
  _XMLSearch *p_Var7;
  SXML_CHAR squote [2];
  SXML_CHAR **local_38;
  
  squote[0] = '\'';
  squote[1] = '\0';
  if (xpath == (SXML_CHAR **)0x0) {
LAB_00106778:
    pSVar3 = (SXML_CHAR *)0x0;
  }
  else if (search == (XMLSearch *)0x0) {
    pSVar3 = strdup("");
    *xpath = pSVar3;
  }
  else {
    squote[0] = 0x22;
    if (quote != '\0') {
      squote[0] = quote;
    }
    squote[1] = '\0';
    for (p_Var7 = search; p_Var7 != (XMLSearch *)0x0; p_Var7 = p_Var7->next) {
      if ((p_Var7 != search) && (pSVar3 = strcat_alloc(xpath,"/"), pSVar3 == (SXML_CHAR *)0x0)) {
LAB_0010676c:
        free(*xpath);
        *xpath = (SXML_CHAR *)0x0;
        goto LAB_00106778;
      }
      pcVar5 = p_Var7->tag;
      src2 = "*";
      if ((pcVar5 != (char *)0x0) && (src2 = pcVar5, *pcVar5 == '\0')) {
        src2 = "*";
      }
      pSVar3 = strcat_alloc(xpath,src2);
      if (pSVar3 == (SXML_CHAR *)0x0) goto LAB_0010676c;
      if ((p_Var7->n_attributes < 1) && ((p_Var7->text == (char *)0x0 || (*p_Var7->text == '\0'))))
      {
        bVar2 = true;
      }
      else {
        pSVar3 = strcat_alloc(xpath,"[");
        if (pSVar3 == (SXML_CHAR *)0x0) goto LAB_0010676c;
        bVar2 = true;
        if ((p_Var7->text != (char *)0x0) && (*p_Var7->text != '\0')) {
          pSVar3 = strcat_alloc(xpath,".=");
          if ((pSVar3 == (SXML_CHAR *)0x0) ||
             (((pSVar3 = strcat_alloc(xpath,squote), pSVar3 == (SXML_CHAR *)0x0 ||
               (pSVar3 = strcat_alloc(xpath,p_Var7->text), pSVar3 == (SXML_CHAR *)0x0)) ||
              (pSVar3 = strcat_alloc(xpath,squote), pSVar3 == (SXML_CHAR *)0x0))))
          goto LAB_0010676c;
          bVar2 = false;
        }
      }
      local_38 = &p_Var7->text;
      lVar6 = 0;
      for (lVar4 = 0; iVar1 = p_Var7->n_attributes, lVar4 < iVar1; lVar4 = lVar4 + 1) {
        if (((!bVar2) && (pSVar3 = strcat_alloc(xpath,", "), pSVar3 == (SXML_CHAR *)0x0)) ||
           ((pSVar3 = strcat_alloc(xpath,"@"), pSVar3 == (SXML_CHAR *)0x0 ||
            (pSVar3 = strcat_alloc(xpath,*(SXML_CHAR **)((long)&p_Var7->attributes->name + lVar6)),
            pSVar3 == (SXML_CHAR *)0x0)))) goto LAB_0010676c;
        if (*(long *)((long)&p_Var7->attributes->value + lVar6) != 0) {
          pcVar5 = "=";
          if (*(int *)((long)&p_Var7->attributes->active + lVar6) == 0) {
            pcVar5 = "!=";
          }
          pSVar3 = strcat_alloc(xpath,pcVar5);
          if (((pSVar3 == (SXML_CHAR *)0x0) ||
              (pSVar3 = strcat_alloc(xpath,squote), pSVar3 == (SXML_CHAR *)0x0)) ||
             ((pSVar3 = strcat_alloc(xpath,*(SXML_CHAR **)((long)&p_Var7->attributes->value + lVar6)
                                    ), pSVar3 == (SXML_CHAR *)0x0 ||
              (pSVar3 = strcat_alloc(xpath,squote), pSVar3 == (SXML_CHAR *)0x0))))
          goto LAB_0010676c;
        }
        lVar6 = lVar6 + 0x18;
        bVar2 = false;
      }
      if (*local_38 == (char *)0x0) {
        if (0 < iVar1) goto LAB_0010674f;
      }
      else if ((0 < iVar1) || (**local_38 != '\0')) {
LAB_0010674f:
        pSVar3 = strcat_alloc(xpath,"]");
        if (pSVar3 == (SXML_CHAR *)0x0) goto LAB_0010676c;
      }
    }
    pSVar3 = *xpath;
  }
  return pSVar3;
}

Assistant:

SXML_CHAR* XMLSearch_get_XPath_string(const XMLSearch* search, SXML_CHAR** xpath, SXML_CHAR quote)
{
	const XMLSearch* s;
	SXML_CHAR squote[] = C2SX("'");
	int i, fill;

	if (xpath == NULL)
		return NULL;

	/* NULL 'search' is an empty string */
	if (search == NULL) {
		*xpath = sx_strdup(C2SX(""));
		if (*xpath == NULL)
			return NULL;

		return *xpath;
	}

	squote[0] = (quote == NULC ? XML_DEFAULT_QUOTE : quote);

	for (s = search; s != NULL; s = s->next) {
		if (s != search && strcat_alloc(xpath, C2SX("/")) == NULL) goto err; /* No "/" prefix for the first criteria */
		if (strcat_alloc(xpath, s->tag == NULL || s->tag[0] == NULC ? C2SX("*"): s->tag) == NULL) goto err;

		if (s->n_attributes > 0 || (s->text != NULL && s->text[0] != NULC))
			if (strcat_alloc(xpath, C2SX("[")) == NULL) goto err;

		fill = FALSE; /* '[' has not been filled with text yet, no ", " separator should be added */
		if (s->text != NULL && s->text[0] != NULC) {
			if (strcat_alloc(xpath, C2SX(".=")) == NULL) goto err;
			if (strcat_alloc(xpath, squote) == NULL) goto err;
			if (strcat_alloc(xpath, s->text) == NULL) goto err;
			if (strcat_alloc(xpath, squote) == NULL) goto err;
			fill = TRUE;
		}

		for (i = 0; i < s->n_attributes; i++) {
			if (fill) {
				if (strcat_alloc(xpath, C2SX(", ")) == NULL) goto err;
			} else
				fill = TRUE; /* filling is being performed */
			if (strcat_alloc(xpath, C2SX("@")) == NULL) goto err;
			if (strcat_alloc(xpath, s->attributes[i].name) == NULL) goto err;
			if (s->attributes[i].value == NULL) continue;

			if (strcat_alloc(xpath, s->attributes[i].active ? C2SX("=") : C2SX("!=")) == NULL) goto err;
			if (strcat_alloc(xpath, squote) == NULL) goto err;
			if (strcat_alloc(xpath, s->attributes[i].value) == NULL) goto err;
			if (strcat_alloc(xpath, squote) == NULL) goto err;
		}
		if ((s->text != NULL && s->text[0] != NULC) || s->n_attributes > 0) {
			if (strcat_alloc(xpath, C2SX("]")) == NULL) goto err;
		}
	}

	return *xpath;

err:
	__free(*xpath);
	*xpath = NULL;

	return NULL;
}